

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

bool __thiscall pbrt::Barrier::Block(Barrier *this)

{
  int *piVar1;
  int iVar2;
  int vb;
  int va;
  unique_lock<std::mutex> lock;
  
  lock._M_owns = false;
  lock._M_device = &this->mutex;
  std::unique_lock<std::mutex>::lock(&lock);
  lock._M_owns = true;
  iVar2 = this->numToBlock;
  va = iVar2 + -1;
  this->numToBlock = va;
  vb = 0;
  if (iVar2 < 1) {
    LogFatal<char_const(&)[11],char_const(&)[2],char_const(&)[11],int&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.cpp"
               ,0x1e,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [11])"numToBlock",
               (char (*) [2])0x2925374,(char (*) [11])"numToBlock",&va,(char (*) [2])0x2925374,&vb);
  }
  if (va == 0) {
    std::condition_variable::notify_all();
  }
  else {
    do {
      std::condition_variable::wait((unique_lock *)&this->cv);
    } while (this->numToBlock != 0);
  }
  piVar1 = &this->numToExit;
  *piVar1 = *piVar1 + -1;
  iVar2 = *piVar1;
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return iVar2 == 0;
}

Assistant:

bool Barrier::Block() {
    std::unique_lock<std::mutex> lock(mutex);

    --numToBlock;
    CHECK_GE(numToBlock, 0);

    if (numToBlock > 0) {
        cv.wait(lock, [this]() { return numToBlock == 0; });
    } else
        cv.notify_all();

    return --numToExit == 0;
}